

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O0

void __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::validateSolveReal(Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *soplex)

{
  bool bVar1;
  type_conflict5 tVar2;
  Status SVar3;
  _Setprecision _Var4;
  char *__nptr;
  element_type *peVar5;
  undefined1 *puVar6;
  ostream *poVar7;
  ostream *r;
  ostream *poVar8;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long in_RDI;
  ostream *os;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  objViolation;
  string reason;
  bool passedValidation;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff308;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff318;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff320;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff350;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff360;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff398;
  ostream *in_stack_fffffffffffff3a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff3b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff3b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff3c0;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff3c8;
  type_conflict5 local_bab;
  type_conflict5 local_ba9;
  undefined4 in_stack_fffffffffffff478;
  undefined4 in_stack_fffffffffffff47c;
  undefined4 in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff484;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff488;
  string local_b58 [48];
  undefined1 local_b28 [16];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff4f0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff4f8;
  undefined1 local_ad8 [32];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff548;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff550;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff558;
  undefined1 local_a78 [80];
  undefined1 local_a28 [96];
  undefined1 local_9c8 [80];
  undefined1 local_978 [96];
  undefined1 local_918 [80];
  undefined1 local_8c8 [80];
  undefined1 local_878 [80];
  undefined8 local_828;
  undefined1 local_820 [80];
  undefined1 local_7d0 [80];
  undefined8 local_780;
  Real local_778;
  Real local_770;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_768;
  undefined1 local_718 [80];
  undefined1 local_6c8 [80];
  double local_678;
  Real local_670;
  Real local_668;
  Verbosity local_65c;
  ostream *local_658;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_650;
  undefined8 local_600;
  undefined1 local_5f8 [80];
  undefined8 local_5a8;
  undefined1 local_5a0 [80];
  undefined8 local_550;
  undefined1 local_548 [80];
  undefined8 local_4f8;
  undefined1 local_4f0 [80];
  undefined8 local_4a0;
  undefined1 local_498 [80];
  undefined8 local_448;
  undefined1 local_440 [80];
  undefined8 local_3f0;
  undefined1 local_3e8 [80];
  undefined8 local_398;
  undefined1 local_390 [80];
  undefined8 local_340;
  undefined1 local_334 [99];
  allocator local_2d1;
  string local_2d0 [39];
  byte local_2a9;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2a8;
  undefined8 local_298;
  undefined8 *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined8 *local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined8 *local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined8 *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined8 *local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 *local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined8 *local_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined8 *local_1e8;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined8 *local_1b8;
  undefined1 *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  long local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  long local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  long local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  long local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  long local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined8 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 *local_90;
  double *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  double *local_78;
  Real *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  Real *local_60;
  Real *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  Real *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_2a9 = 1;
  local_2a8 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"",&local_2d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  local_340 = 0;
  local_288 = local_334;
  local_290 = &local_340;
  local_298 = 0;
  local_a8 = local_290;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff320,(double)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  local_398 = 0;
  local_270 = local_390;
  local_278 = &local_398;
  local_280 = 0;
  local_b0 = local_278;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff320,(double)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  local_3f0 = 0;
  local_258 = local_3e8;
  local_260 = &local_3f0;
  local_268 = 0;
  local_b8 = local_260;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff320,(double)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  local_448 = 0;
  local_240 = local_440;
  local_248 = &local_448;
  local_250 = 0;
  local_c0 = local_248;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff320,(double)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  local_4a0 = 0;
  local_228 = local_498;
  local_230 = &local_4a0;
  local_238 = 0;
  local_c8 = local_230;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff320,(double)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  local_4f8 = 0;
  local_210 = local_4f0;
  local_218 = &local_4f8;
  local_220 = 0;
  local_d0 = local_218;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff320,(double)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  local_550 = 0;
  local_1f8 = local_548;
  local_200 = &local_550;
  local_208 = 0;
  local_d8 = local_200;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff320,(double)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  local_5a8 = 0;
  local_1e0 = local_5a0;
  local_1e8 = &local_5a8;
  local_1f0 = 0;
  local_e0 = local_1e8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff320,(double)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  local_600 = 0;
  local_1c8 = local_5f8;
  local_1d0 = &local_600;
  local_1d8 = 0;
  local_e8 = local_1d0;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff320,(double)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  local_1a8 = &local_650;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff310);
  local_65c = INFO1;
  local_658 = SPxOut::getStream(&local_2a8->spxout,&local_65c);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308);
  if (bVar1) {
    local_668 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::realParam(local_2a8,INFTY);
    local_50 = &local_650;
    local_58 = &local_668;
    local_48 = local_58;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              (in_stack_fffffffffffff3c8,(double)in_stack_fffffffffffff3c0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308);
    if (bVar1) {
      local_670 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::realParam(local_2a8,INFTY);
      local_670 = -local_670;
      local_68 = &local_650;
      local_70 = &local_670;
      local_60 = local_70;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                (in_stack_fffffffffffff3c8,(double)in_stack_fffffffffffff3c0);
    }
    else {
      __nptr = (char *)std::__cxx11::string::c_str();
      local_678 = atof(__nptr);
      local_80 = &local_650;
      local_88 = &local_678;
      local_78 = local_88;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                (in_stack_fffffffffffff3c8,(double)in_stack_fffffffffffff3c0);
    }
  }
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::objValueReal(in_stack_fffffffffffff348);
  local_30 = &local_650;
  local_38 = &local_768;
  local_28 = local_718;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30,local_38);
  local_20 = local_718;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff310);
  local_10 = local_30;
  local_18 = local_38;
  local_8 = local_718;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308,
             (cpp_dec_float<100U,_int,_void> *)0x4a82c2);
  spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)in_stack_fffffffffffff308);
  local_f8 = local_334;
  local_100 = local_6c8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308);
  SVar3 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::status(local_2a8);
  local_ba9 = false;
  if (SVar3 == INForUNBD) {
    local_770 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::realParam(local_2a8,INFTY);
    tVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff308,(double *)0x4a8367);
    local_bab = true;
    if (!tVar2) {
      local_778 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::realParam(local_2a8,INFTY);
      local_778 = -local_778;
      local_bab = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff308,(double *)0x4a83c2);
    }
    local_ba9 = local_bab;
  }
  if (local_ba9 != false) {
    local_780 = 0;
    local_98 = local_334;
    local_a0 = &local_780;
    local_90 = local_a0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              (in_stack_fffffffffffff3c8,(double)in_stack_fffffffffffff3c0);
  }
  local_198 = local_7d0;
  local_1a0 = local_334;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308);
  local_828 = 0;
  local_1b0 = local_820;
  local_1b8 = &local_828;
  local_1c0 = 0;
  local_f0 = local_1b8;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff320,(double)in_stack_fffffffffffff318,in_stack_fffffffffffff310);
  local_190 = in_RDI + 0x28;
  local_188 = local_878;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308);
  bVar1 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_2a9 = 0;
    std::__cxx11::string::operator+=(local_2d0,"Objective Violation; ");
  }
  SVar3 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::status(local_2a8);
  if (SVar3 == OPTIMAL) {
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBoundViolation(in_stack_fffffffffffff488,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRowViolation(in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8)
    ;
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRedCostViolation
              (in_stack_fffffffffffff558,in_stack_fffffffffffff550,in_stack_fffffffffffff548);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getDualViolation(in_stack_fffffffffffff558,in_stack_fffffffffffff550,in_stack_fffffffffffff548
                      );
    local_178 = local_8c8;
    local_180 = local_390;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308
              );
    local_170 = in_RDI + 0x28;
    local_168 = local_918;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308
              );
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffff308);
    peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4a86b5);
    Tolerances::epsilon(peVar5);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_fffffffffffff360,in_stack_fffffffffffff358,
                       (double)in_stack_fffffffffffff350);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a870c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Bound Violation; ");
    }
    local_158 = local_978;
    local_160 = local_3e8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308
              );
    local_150 = in_RDI + 0x28;
    local_148 = local_9c8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308
              );
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffff308);
    peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4a87f7);
    Tolerances::epsilon(peVar5);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_fffffffffffff360,in_stack_fffffffffffff358,
                       (double)in_stack_fffffffffffff350);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a884e);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Row Violation; ");
    }
    local_138 = local_a28;
    local_140 = local_440;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308
              );
    local_130 = in_RDI + 0x28;
    local_128 = local_a78;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308
              );
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffff308);
    peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4a8939);
    Tolerances::epsilon(peVar5);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_fffffffffffff360,in_stack_fffffffffffff358,
                       (double)in_stack_fffffffffffff350);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a8990);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Reduced Cost Violation; ");
    }
    local_118 = local_ad8;
    local_120 = local_498;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308
              );
    local_110 = in_RDI + 0x28;
    local_108 = local_b28;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff310,(cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff308
              );
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(in_stack_fffffffffffff308);
    peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4a8a7b);
    Tolerances::epsilon(peVar5);
    bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_fffffffffffff360,in_stack_fffffffffffff358,
                       (double)in_stack_fffffffffffff350);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4a8ad2);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_2a9 = 0;
      std::__cxx11::string::operator+=(local_2d0,"Dual Violation; ");
    }
  }
  std::operator<<(local_658,"\n");
  std::operator<<(local_658,"Validation          :");
  if ((local_2a9 & 1) == 0) {
    std::__cxx11::string::length();
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_2d0);
    poVar7 = local_658;
    *puVar6 = 0x5d;
    std::operator+((char *)in_stack_fffffffffffff358,in_stack_fffffffffffff350);
    std::operator+(in_stack_fffffffffffff318,(char *)in_stack_fffffffffffff310);
    std::operator<<(poVar7,local_b58);
    std::__cxx11::string::~string(local_b58);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff488);
  }
  else {
    std::operator<<(local_658," Success\n");
  }
  poVar7 = std::operator<<(local_658,"   Objective        : ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::scientific);
  _Var4 = std::setprecision(8);
  std::operator<<(poVar7,_Var4);
  poVar7 = boost::multiprecision::operator<<(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::fixed);
  std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(local_658,"   Bound            : ");
  r = (ostream *)std::ostream::operator<<(poVar7,std::scientific);
  _Var4 = std::setprecision(8);
  std::operator<<(r,_Var4);
  poVar8 = boost::multiprecision::operator<<
                     (poVar7,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(local_658,"   Row              : ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::scientific);
  _Var4 = std::setprecision(8);
  std::operator<<(poVar8,_Var4);
  poVar8 = boost::multiprecision::operator<<
                     (poVar7,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(local_658,"   Reduced Cost     : ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::scientific);
  _Var4 = std::setprecision(8);
  std::operator<<(poVar8,_Var4);
  poVar8 = boost::multiprecision::operator<<
                     (poVar7,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::fixed);
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(local_658,"   Dual             : ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::scientific);
  _Var4 = std::setprecision(8);
  std::operator<<(poVar8,_Var4);
  poVar7 = boost::multiprecision::operator<<
                     (poVar7,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)r);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::fixed);
  std::operator<<(poVar7,"\n");
  std::__cxx11::string::~string(local_2d0);
  return;
}

Assistant:

void Validation<R>::validateSolveReal(SoPlexBase<R>& soplex)
{
   bool passedValidation = true;
   std::string reason = "";
   R objViolation = 0.0;
   R maxBoundViolation = 0.0;
   R maxRowViolation = 0.0;
   R maxRedCostViolation = 0.0;
   R maxDualViolation = 0.0;
   R sumBoundViolation = 0.0;
   R sumRowViolation = 0.0;
   R sumRedCostViolation = 0.0;
   R sumDualViolation = 0.0;
   R sol;

   std::ostream& os = soplex.spxout.getStream(SPxOut::INFO1);

   if(validatesolution == "+infinity")
   {
      sol = soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else if(validatesolution == "-infinity")
   {
      sol = -soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else
   {
      sol = atof(validatesolution.c_str());
   }

   objViolation = spxAbs(sol - soplex.objValueReal());

   // skip check in case presolving detected infeasibility/unboundedness
   if(SPxSolverBase<R>::INForUNBD == soplex.status() &&
         (sol == soplex.realParam(SoPlexBase<R>::INFTY)
          || sol == -soplex.realParam(SoPlexBase<R>::INFTY)))
      objViolation = 0.0;

   if(! EQ(objViolation, R(0.0), validatetolerance))
   {
      passedValidation = false;
      reason += "Objective Violation; ";
   }

   if(SPxSolverBase<R>::OPTIMAL == soplex.status())
   {
      soplex.getBoundViolation(maxBoundViolation, sumBoundViolation);
      soplex.getRowViolation(maxRowViolation, sumRowViolation);
      soplex.getRedCostViolation(maxRedCostViolation, sumRedCostViolation);
      soplex.getDualViolation(maxDualViolation, sumDualViolation);

      if(! LE(maxBoundViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Bound Violation; ";
      }

      if(! LE(maxRowViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Row Violation; ";
      }

      if(! LE(maxRedCostViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Reduced Cost Violation; ";
      }

      if(! LE(maxDualViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Dual Violation; ";
      }
   }

   os << "\n";
   os << "Validation          :";

   if(passedValidation)
      os << " Success\n";
   else
   {
      reason[reason.length() - 2] = ']';
      os << " Fail [" + reason + "\n";
   }

   os << "   Objective        : " << std::scientific << std::setprecision(
         8) << objViolation << std::fixed << "\n";
   os << "   Bound            : " << std::scientific << std::setprecision(
         8) << maxBoundViolation << std::fixed << "\n";
   os << "   Row              : " << std::scientific << std::setprecision(
         8) << maxRowViolation << std::fixed << "\n";
   os << "   Reduced Cost     : " << std::scientific << std::setprecision(
         8) << maxRedCostViolation << std::fixed << "\n";
   os << "   Dual             : " << std::scientific << std::setprecision(
         8) << maxDualViolation << std::fixed << "\n";
}